

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit.cpp
# Opt level: O3

void __thiscall QTextEdit::timerEvent(QTextEdit *this,QTimerEvent *e)

{
  long lVar1;
  QPoint QVar2;
  uint uVar3;
  QWidget *parent;
  QPoint QVar4;
  undefined8 uVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  long in_FS_OFFSET;
  QArrayData *local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  double local_c8;
  double dStack_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  QMouseEvent ev;
  QPoint local_48;
  QPoint local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
  if (*(int *)(e + 0x10) == *(int *)(lVar1 + 0x308)) {
    lVar10 = *(long *)(*(long *)(lVar1 + 0x2b0) + 0x20);
    uVar11 = *(int *)(lVar10 + 0x1c) - *(int *)(lVar10 + 0x14);
    uVar16 = *(int *)(lVar10 + 0x20) - *(int *)(lVar10 + 0x18);
    if ((*(byte *)(lVar1 + 800) & 8) == 0) {
      local_48 = (QPoint)QCursor::pos();
      local_40 = QWidget::mapFromGlobal(*(QWidget **)(lVar1 + 0x2b0),&local_48);
      _ev = &DAT_aaaaaaaaaaaaaaaa;
      local_a8 = (double)local_40.xp.m_i.m_i;
      local_a0 = (double)local_40.yp.m_i.m_i;
      parent = QWidget::window((QWidget *)this);
      QVar4 = QWidget::mapTo((QWidget *)this,parent,&local_40);
      local_b8 = (double)QVar4.xp.m_i.m_i;
      local_b0 = (double)QVar4.yp.m_i.m_i;
      local_c8 = (double)local_48.xp.m_i.m_i;
      dStack_c0 = (double)local_48.yp.m_i.m_i;
      local_e8 = (QArrayData *)0x0;
      uStack_e0 = 0;
      local_d8 = 0;
      uVar5 = QPointingDevice::primaryPointingDevice((QString *)&local_e8);
      QMouseEvent::QMouseEvent(&ev,5,&local_a8,&local_b8,&local_c8,1,1,0,uVar5);
      if (local_e8 != (QArrayData *)0x0) {
        LOCK();
        (local_e8->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_e8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_e8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_e8,2,0x10);
        }
      }
      (**(code **)(*(long *)&(this->super_QAbstractScrollArea).super_QFrame.super_QWidget + 0xb0))
                (this,&ev);
      QMouseEvent::~QMouseEvent(&ev);
      QVar4 = (QPoint)((ulong)local_40 & 0xffffffff);
      uVar15 = 0;
      QVar2 = local_40;
    }
    else {
      QVar4 = *(QPoint *)(lVar1 + 0x30c);
      uVar14 = (int)(uVar11 + 1) / 3;
      uVar9 = (ulong)uVar14;
      if (0x13 < (int)uVar14) {
        uVar9 = 0x14;
      }
      uVar14 = (int)(uVar16 + 1) / 3;
      if (0x13 < (int)uVar14) {
        uVar14 = 0x14;
      }
      uVar16 = uVar16 - uVar14;
      uVar15 = (ulong)uVar14 << 0x20 | uVar9;
      uVar11 = uVar11 - (int)uVar9;
      local_40.yp = QVar4.yp.m_i;
      QVar2 = QVar4;
    }
    local_40 = QVar2;
    iVar13 = uVar16 - local_40.yp.m_i;
    iVar7 = (int)(uVar15 >> 0x20);
    iVar6 = local_40.yp.m_i - iVar7;
    if (iVar6 <= iVar13) {
      iVar6 = iVar13;
    }
    uVar14 = ~uVar16 + iVar7 + iVar6;
    iVar7 = uVar11 - QVar4.xp.m_i;
    iVar13 = (int)uVar15;
    iVar6 = QVar4.xp.m_i.m_i - iVar13;
    if (iVar6 <= iVar7) {
      iVar6 = iVar7;
    }
    uVar12 = ~uVar11 + iVar13 + iVar6;
    uVar3 = uVar14;
    if ((int)uVar14 < (int)uVar12) {
      uVar3 = uVar12;
    }
    if (-1 < (int)uVar3) {
      uVar8 = 7;
      if (7 < uVar3) {
        uVar8 = uVar3;
      }
      QBasicTimer::start(lVar1 + 0x308,(0x1324 / (ulong)(uVar8 * uVar8)) * 1000000,1,this);
      if (0 < (int)uVar14) {
        lVar10 = (long)(int)uVar16 + ((long)uVar15 >> 0x20);
        QAbstractSlider::triggerAction
                  (*(QAbstractSlider **)(lVar1 + 0x290),
                   (local_40.yp.m_i < (int)((ulong)(lVar10 - (lVar10 >> 0x3f)) >> 1)) +
                   SliderSingleStepAdd);
      }
      if (0 < (int)uVar12) {
        QAbstractSlider::triggerAction
                  (*(QAbstractSlider **)(lVar1 + 0x288),
                   (local_40.xp.m_i <
                   (int)((ulong)(((long)(int)uVar11 + (long)iVar13) -
                                ((long)(int)uVar11 + (long)iVar13 >> 0x3f)) >> 1)) +
                   SliderSingleStepAdd);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextEdit::timerEvent(QTimerEvent *e)
{
    Q_D(QTextEdit);
    if (e->timerId() == d->autoScrollTimer.timerId()) {
        QRect visible = d->viewport->rect();
        QPoint pos;
        if (d->inDrag) {
            pos = d->autoScrollDragPos;
            visible.adjust(qMin(visible.width()/3,20), qMin(visible.height()/3,20),
                           -qMin(visible.width()/3,20), -qMin(visible.height()/3,20));
        } else {
            const QPoint globalPos = QCursor::pos();
            pos = d->viewport->mapFromGlobal(globalPos);
            QMouseEvent ev(QEvent::MouseMove, pos, mapTo(topLevelWidget(), pos), globalPos, Qt::LeftButton, Qt::LeftButton, Qt::NoModifier);
            mouseMoveEvent(&ev);
        }
        int deltaY = qMax(pos.y() - visible.top(), visible.bottom() - pos.y()) - visible.height();
        int deltaX = qMax(pos.x() - visible.left(), visible.right() - pos.x()) - visible.width();
        int delta = qMax(deltaX, deltaY);
        if (delta >= 0) {
            if (delta < 7)
                delta = 7;
            int timeout = 4900 / (delta * delta);
            d->autoScrollTimer.start(timeout, this);

            if (deltaY > 0)
                d->vbar->triggerAction(pos.y() < visible.center().y() ?
                                       QAbstractSlider::SliderSingleStepSub
                                       : QAbstractSlider::SliderSingleStepAdd);
            if (deltaX > 0)
                d->hbar->triggerAction(pos.x() < visible.center().x() ?
                                       QAbstractSlider::SliderSingleStepSub
                                       : QAbstractSlider::SliderSingleStepAdd);
        }
    }
#ifdef QT_KEYPAD_NAVIGATION
    else if (e->timerId() == d->deleteAllTimer.timerId()) {
        d->deleteAllTimer.stop();
        clear();
    }
#endif
}